

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_bra_8(m68k_info *info)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = info->ir;
  MCInst_setOpcode(info->inst,0x1b);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x1;
  (info->extension).operands[0].type = M68K_OP_BR_DISP;
  (info->extension).operands[0].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
  (info->extension).operands[0].br_disp.disp = (int)(char)uVar2 & 0xffffff00U | uVar2 & 0xff;
  (info->extension).operands[0].br_disp.disp_size = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x01';
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\a';
  return;
}

Assistant:

static void d68000_bra_8(m68k_info *info)
{
	build_relative_branch(info, M68K_INS_BRA, 1, make_int_8(info->ir));
}